

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O3

void czh::utils::grisu_round
               (string *buffer,uint64_t delta,uint64_t rest,uint64_t ten_kappa,uint64_t wp_w)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = wp_w - rest;
  if (ten_kappa <= delta - rest && (rest <= wp_w && uVar2 != 0)) {
    uVar3 = rest + ten_kappa;
    uVar4 = delta - uVar3;
    do {
      if ((wp_w <= uVar3) && (uVar2 <= uVar3 - wp_w)) {
        return;
      }
      pcVar1 = (buffer->_M_dataplus)._M_p + (buffer->_M_string_length - 1);
      *pcVar1 = *pcVar1 + -1;
      bVar5 = ten_kappa <= uVar4;
      uVar4 = uVar4 - ten_kappa;
      if (wp_w <= uVar3) {
        return;
      }
      uVar2 = uVar2 - ten_kappa;
      uVar3 = uVar3 + ten_kappa;
    } while (bVar5);
  }
  return;
}

Assistant:

void grisu_round(std::string &buffer, uint64_t delta, uint64_t rest, uint64_t ten_kappa, uint64_t wp_w)
  {
    while (rest < wp_w &&
           delta - rest >= ten_kappa &&
           (rest + ten_kappa < wp_w || /// closer
            wp_w - rest > rest + ten_kappa - wp_w))
    {
      --buffer.back();
      rest += ten_kappa;
    }
  }